

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

void __thiscall
Js::FunctionExecutionStateMachine::TransitionToFullJitExecutionMode
          (FunctionExecutionStateMachine *this)

{
  FunctionExecutionStateMachine *this_local;
  
  CommitExecutedIterations(this);
  this->interpreterLimit = 0;
  this->autoProfilingInterpreter0Limit = 0;
  this->profilingInterpreter0Limit = 0;
  this->autoProfilingInterpreter1Limit = 0;
  this->simpleJitLimit = 0;
  this->profilingInterpreter1Limit = 0;
  this->fullJitThreshold = 0;
  VerifyExecutionModeLimits(this);
  SetExecutionState(this,FullJit);
  return;
}

Assistant:

void FunctionExecutionStateMachine::TransitionToFullJitExecutionMode()
    {
        CommitExecutedIterations();

        interpreterLimit = 0;
        autoProfilingInterpreter0Limit = 0;
        profilingInterpreter0Limit = 0;
        autoProfilingInterpreter1Limit = 0;
        simpleJitLimit = 0;
        profilingInterpreter1Limit = 0;
        fullJitThreshold = 0;

        VerifyExecutionModeLimits();
        SetExecutionState(ExecutionState::FullJit);
    }